

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O1

double __thiscall
imrt::IntensityILS::iLocalSearch(IntensityILS *this,Plan *P,double max_time,bool verbose)

{
  double *pdVar1;
  uint i;
  int j;
  Station *s;
  long *******ppppppplVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Station *this_00;
  pointer ppVar6;
  ostream *poVar7;
  int b;
  int iVar8;
  long *******ppppppplVar9;
  _List_node_base *p_Var10;
  double dVar11;
  double dVar12;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> cells;
  long *******local_a8;
  long *******local_a0;
  undefined8 local_98;
  Plan *local_90;
  _List_node_base *local_88;
  pointer local_80;
  pointer local_78;
  double local_70;
  double local_68;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_60;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  this_00 = (Station *)Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            (&local_60,(list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)this_00);
  local_a8 = (long *******)&local_a8;
  local_98 = 0;
  local_a0 = local_a8;
  local_90 = P;
  Plan::getEvaluation(P);
  p_Var10 = (_List_node_base *)&local_60;
  do {
    p_Var10 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&p_Var10->_M_next)
              ->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var10 == (_List_node_base *)&local_60) break;
    s = (Station *)p_Var10[1]._M_next;
    getShuffledCells(&local_48,(IntensityILS *)this_00,s);
    local_80 = local_48.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppVar6 = local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = p_Var10;
    if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = true;
    }
    else {
      do {
        i = ppVar6->first;
        j = ppVar6->second;
        local_78 = ppVar6;
        iVar4 = rand();
        iVar8 = 0;
        do {
          dVar12 = (s->I).p[(int)i][j];
          if (iVar4 % 2 == iVar8) {
            this_00 = (Station *)(ulong)i;
            dVar11 = Station::intensityUp(s,i,j);
          }
          else {
            this_00 = (Station *)(ulong)i;
            dVar11 = Station::intensityDown(s,i,j);
          }
          uVar5 = 8;
          pdVar1 = (s->I).p[(int)i] + j;
          if ((dVar11 != *pdVar1) || (NAN(dVar11) || NAN(*pdVar1))) {
            dVar12 = dVar11 - dVar12;
            this_00 = s;
            local_68 = dVar11;
            dVar11 = Plan::get_delta_eval(local_90,s,i,j,dVar12,999999);
            uVar5 = 0;
            if (dVar11 < -0.05) {
              poVar7 = std::ostream::_M_insert<double>(dVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
              poVar7 = std::ostream::_M_insert<double>(dVar12);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              Station::change_intensity
                        (s,i,j,local_68,
                         (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         0x0);
              this_00 = s;
              local_70 = Plan::incremental_eval(local_90,s,i,j,dVar12);
              uVar5 = 1;
            }
          }
          if ((uVar5 & 7) != 0) goto LAB_001222f3;
          iVar8 = iVar8 + 1;
        } while (iVar8 == 1);
        uVar5 = 6;
LAB_001222f3:
        bVar3 = uVar5 == 0 || uVar5 == 6;
      } while ((uVar5 == 0 || uVar5 == 6) && (ppVar6 = local_78 + 1, ppVar6 != local_80));
    }
    if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    p_Var10 = local_88;
  } while (bVar3);
  ppppppplVar9 = local_a8;
  if ((long ********)local_a8 != &local_a8) {
    do {
      ppppppplVar2 = (long *******)*ppppppplVar9;
      operator_delete(ppppppplVar9);
      ppppppplVar9 = ppppppplVar2;
    } while ((long ********)ppppppplVar2 != &local_a8);
  }
  while (local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_60) {
    p_Var10 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var10;
  }
  return local_70;
}

Assistant:

double IntensityILS::iLocalSearch(Plan& P, double max_time, bool verbose){
		 const list<Station*> stations=P.get_stations();
		 list< pair< int, double > > diff;
		 double eval =P.getEvaluation();

		 for(auto s:stations){
			  vector < pair<int, int> > cells = getShuffledCells(s);
				for(auto cell:cells){
					int a=rand()%2;
					for(int b=0; b<2;b++){
					  int i=cell.first, j=cell.second;
            double intensity, old=s->I(i,j);
						if(a==b) intensity=s->intensityUp(i,j);
						else intensity=s->intensityDown(i,j);
						if(intensity==s->I(i,j)) continue;
            double delta_eval = P.get_delta_eval (*s, i, j, intensity-old);

						if(delta_eval<-0.05){
              cout << delta_eval << ":" << intensity-old << endl;
              //cout << P.getEvaluationFunction()->get_impact_beamlet(s->getAngle(),s->pos2beam[make_pair(i,j)]) << endl;
              s->change_intensity(i, j, intensity);
              return P.incremental_eval(*s, i, j, intensity-old);
            }

					}
				}
		 }
	 }